

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::OutputFile::OutputFile(OutputFile *this,OutputPartData *part)

{
  bool bVar1;
  ArgExc *this_00;
  _func_int **pp_Var2;
  long in_RSI;
  GenericOutputFile *in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  Data *in_stack_fffffffffffffe80;
  
  GenericOutputFile::GenericOutputFile(in_RDI);
  in_RDI->_vptr_GenericOutputFile = (_func_int **)&PTR__OutputFile_002acda8;
  in_RDI[1]._vptr_GenericOutputFile = (_func_int **)0x0;
  Header::type_abi_cxx11_((Header *)0x2163e1);
  bVar1 = std::operator!=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  if (!bVar1) {
    pp_Var2 = (_func_int **)operator_new(0x148);
    Data::Data(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    in_RDI[1]._vptr_GenericOutputFile = pp_Var2;
    in_RDI[1]._vptr_GenericOutputFile[0x27] = *(_func_int **)(in_RSI + 0x58);
    *(undefined1 *)(in_RDI[1]._vptr_GenericOutputFile + 0x28) = 0;
    *(byte *)(in_RDI[1]._vptr_GenericOutputFile + 7) = *(byte *)(in_RSI + 0x50) & 1;
    initialize((OutputFile *)in_stack_fffffffffffffe80,
               (Header *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    *(undefined4 *)(in_RDI[1]._vptr_GenericOutputFile + 0x26) = *(undefined4 *)(in_RSI + 0x4c);
    in_RDI[1]._vptr_GenericOutputFile[0x20] = *(_func_int **)(in_RSI + 0x38);
    in_RDI[1]._vptr_GenericOutputFile[8] = *(_func_int **)(in_RSI + 0x40);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Can\'t build a OutputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

OutputFile::OutputFile (const OutputPartData* part) : _data (NULL)
{
    try
    {
        if (part->header.type () != SCANLINEIMAGE)
            throw IEX_NAMESPACE::ArgExc (
                "Can't build a OutputFile from a type-mismatched part.");

        _data                = new Data (part->numThreads);
        _data->_streamData   = part->mutex;
        _data->_deleteStream = false;
        _data->multiPart     = part->multipart;

        initialize (part->header);
        _data->partNumber          = part->partNumber;
        _data->lineOffsetsPosition = part->chunkOffsetTablePosition;
        _data->previewPosition     = part->previewPosition;
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        if (_data) delete _data;

        REPLACE_EXC (
            e,
            "Cannot initialize output part "
            "\"" << part->partNumber
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        if (_data) delete _data;

        throw;
    }
}